

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O1

void __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolverTest_TestOneof_Test::TestBody
          (DescriptorPoolTypeResolverTest_TestOneof_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TypeResolver *pTVar2;
  Field *pFVar3;
  Type *pTVar4;
  pointer *__ptr_1;
  char *in_R9;
  pointer *__ptr;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view oneof_name;
  string_view oneof_name_00;
  string_view oneof_name_01;
  string_view oneof_name_02;
  AssertionResult gtest_ar_;
  Type type;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d8;
  AssertHelper local_d0;
  internal local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  string local_b8;
  Type local_98;
  
  Type::Type(&local_98,(Arena *)0x0);
  pTVar2 = (this->super_DescriptorPoolTypeResolverTest).resolver_._M_t.
           super___uniq_ptr_impl<google::protobuf::util::TypeResolver,_std::default_delete<google::protobuf::util::TypeResolver>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::TypeResolver_*,_std::default_delete<google::protobuf::util::TypeResolver>_>
           .super__Head_base<0UL,_google::protobuf::util::TypeResolver_*,_false>._M_head_impl;
  GetTypeUrl<proto2_unittest::TestAllTypes>();
  pTVar4 = &local_98;
  (*pTVar2->_vptr_TypeResolver[2])(&local_d8,pTVar2,&local_b8);
  local_c8[0] = (internal)((StatusRep *)local_d8._M_head_impl == (StatusRep *)0x1);
  local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (((ulong)local_d8._M_head_impl & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_d8._M_head_impl);
  }
  paVar1 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,local_c8,
               (AssertionResult *)
               "resolver_ ->ResolveMessageType( GetTypeUrl<proto2_unittest::TestAllTypes>(), &type) .ok()"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x130,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
  }
  else {
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    name_03._M_str = (char *)pTVar4;
    name_03._M_len = (size_t)"oneof_uint32";
    pFVar3 = FindField((anon_unknown_0 *)&local_98,(Type *)&DAT_0000000c,name_03);
    if (((pFVar3 == (Field *)0x0) || ((pFVar3->field_0)._impl_.cardinality_ != 1)) ||
       ((pFVar3->field_0)._impl_.kind_ != 0xd)) {
      local_c8[0] = (internal)0x0;
    }
    else {
      local_c8[0] = (internal)((pFVar3->field_0)._impl_.number_ == 0x6f);
    }
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_b8,local_c8,
                 (AssertionResult *)
                 "HasField(type, Field::CARDINALITY_OPTIONAL, Field::TYPE_UINT32, \"oneof_uint32\", 111)"
                 ,"false","true",in_R9);
      pTVar4 = (Type *)0x132;
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x132,local_b8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((StatusRep *)local_d8._M_head_impl != (StatusRep *)0x0) {
        (**(code **)(*(long *)local_d8._M_head_impl + 8))();
      }
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    name_04._M_str = (char *)pTVar4;
    name_04._M_len = (size_t)"oneof_nested_message";
    pFVar3 = FindField((anon_unknown_0 *)&local_98,(Type *)&DAT_00000014,name_04);
    if (((pFVar3 == (Field *)0x0) || ((pFVar3->field_0)._impl_.cardinality_ != 1)) ||
       ((pFVar3->field_0)._impl_.kind_ != 0xb)) {
      local_c8[0] = (internal)0x0;
    }
    else {
      local_c8[0] = (internal)((pFVar3->field_0)._impl_.number_ == 0x70);
    }
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_b8,local_c8,
                 (AssertionResult *)
                 "HasField(type, Field::CARDINALITY_OPTIONAL, Field::TYPE_MESSAGE, \"oneof_nested_message\", 112)"
                 ,"false","true",in_R9);
      pTVar4 = (Type *)0x134;
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x134,local_b8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((StatusRep *)local_d8._M_head_impl != (StatusRep *)0x0) {
        (**(code **)(*(long *)local_d8._M_head_impl + 8))();
      }
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    name_05._M_str = (char *)pTVar4;
    name_05._M_len = (size_t)"oneof_string";
    pFVar3 = FindField((anon_unknown_0 *)&local_98,(Type *)&DAT_0000000c,name_05);
    if (((pFVar3 == (Field *)0x0) || ((pFVar3->field_0)._impl_.cardinality_ != 1)) ||
       ((pFVar3->field_0)._impl_.kind_ != 9)) {
      local_c8[0] = (internal)0x0;
    }
    else {
      local_c8[0] = (internal)((pFVar3->field_0)._impl_.number_ == 0x71);
    }
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_b8,local_c8,
                 (AssertionResult *)
                 "HasField(type, Field::CARDINALITY_OPTIONAL, Field::TYPE_STRING, \"oneof_string\", 113)"
                 ,"false","true",in_R9);
      pTVar4 = (Type *)0x136;
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x136,local_b8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((StatusRep *)local_d8._M_head_impl != (StatusRep *)0x0) {
        (**(code **)(*(long *)local_d8._M_head_impl + 8))();
      }
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    name_06._M_str = (char *)pTVar4;
    name_06._M_len = (size_t)"oneof_bytes";
    pFVar3 = FindField((anon_unknown_0 *)&local_98,(Type *)&DAT_0000000b,name_06);
    if (((pFVar3 == (Field *)0x0) || ((pFVar3->field_0)._impl_.cardinality_ != 1)) ||
       ((pFVar3->field_0)._impl_.kind_ != 0xc)) {
      local_c8[0] = (internal)0x0;
    }
    else {
      local_c8[0] = (internal)((pFVar3->field_0)._impl_.number_ == 0x72);
    }
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_b8,local_c8,
                 (AssertionResult *)
                 "HasField(type, Field::CARDINALITY_OPTIONAL, Field::TYPE_BYTES, \"oneof_bytes\", 114)"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x138,local_b8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((StatusRep *)local_d8._M_head_impl != (StatusRep *)0x0) {
        (**(code **)(*(long *)local_d8._M_head_impl + 8))();
      }
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    name._M_str = "oneof_uint32";
    name._M_len = 0xc;
    oneof_name._M_str = "oneof_field";
    oneof_name._M_len = 0xb;
    local_c8[0] = (internal)FieldInOneof(&local_98,name,oneof_name);
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_c8[0]) {
      testing::Message::Message((Message *)&local_d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_b8,local_c8,
                 (AssertionResult *)"FieldInOneof(type, \"oneof_uint32\", \"oneof_field\")","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x139,local_b8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((StatusRep *)local_d8._M_head_impl != (StatusRep *)0x0) {
        (**(code **)(*(long *)local_d8._M_head_impl + 8))();
      }
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    name_00._M_str = "oneof_nested_message";
    name_00._M_len = 0x14;
    oneof_name_00._M_str = "oneof_field";
    oneof_name_00._M_len = 0xb;
    local_c8[0] = (internal)FieldInOneof(&local_98,name_00,oneof_name_00);
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_c8[0]) {
      testing::Message::Message((Message *)&local_d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_b8,local_c8,
                 (AssertionResult *)"FieldInOneof(type, \"oneof_nested_message\", \"oneof_field\")",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x13a,local_b8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((StatusRep *)local_d8._M_head_impl != (StatusRep *)0x0) {
        (**(code **)(*(long *)local_d8._M_head_impl + 8))();
      }
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    name_01._M_str = "oneof_string";
    name_01._M_len = 0xc;
    oneof_name_01._M_str = "oneof_field";
    oneof_name_01._M_len = 0xb;
    local_c8[0] = (internal)FieldInOneof(&local_98,name_01,oneof_name_01);
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_c8[0]) {
      testing::Message::Message((Message *)&local_d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_b8,local_c8,
                 (AssertionResult *)"FieldInOneof(type, \"oneof_string\", \"oneof_field\")","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x13b,local_b8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((StatusRep *)local_d8._M_head_impl != (StatusRep *)0x0) {
        (**(code **)(*(long *)local_d8._M_head_impl + 8))();
      }
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    name_02._M_str = "oneof_bytes";
    name_02._M_len = 0xb;
    oneof_name_02._M_str = "oneof_field";
    oneof_name_02._M_len = 0xb;
    local_c8[0] = (internal)FieldInOneof(&local_98,name_02,oneof_name_02);
    local_c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_c8[0]) goto LAB_00bd72cb;
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,local_c8,
               (AssertionResult *)"FieldInOneof(type, \"oneof_bytes\", \"oneof_field\")","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x13c,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((StatusRep *)local_d8._M_head_impl != (StatusRep *)0x0) {
    (**(code **)(*(long *)local_d8._M_head_impl + 8))();
  }
LAB_00bd72cb:
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  Type::~Type(&local_98);
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverTest, TestOneof) {
  Type type;
  ASSERT_TRUE(resolver_
                  ->ResolveMessageType(
                      GetTypeUrl<proto2_unittest::TestAllTypes>(), &type)
                  .ok());
  EXPECT_TRUE(HasField(type, Field::CARDINALITY_OPTIONAL, Field::TYPE_UINT32,
                       "oneof_uint32", 111));
  EXPECT_TRUE(HasField(type, Field::CARDINALITY_OPTIONAL, Field::TYPE_MESSAGE,
                       "oneof_nested_message", 112));
  EXPECT_TRUE(HasField(type, Field::CARDINALITY_OPTIONAL, Field::TYPE_STRING,
                       "oneof_string", 113));
  EXPECT_TRUE(HasField(type, Field::CARDINALITY_OPTIONAL, Field::TYPE_BYTES,
                       "oneof_bytes", 114));
  EXPECT_TRUE(FieldInOneof(type, "oneof_uint32", "oneof_field"));
  EXPECT_TRUE(FieldInOneof(type, "oneof_nested_message", "oneof_field"));
  EXPECT_TRUE(FieldInOneof(type, "oneof_string", "oneof_field"));
  EXPECT_TRUE(FieldInOneof(type, "oneof_bytes", "oneof_field"));
}